

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.hpp
# Opt level: O0

double * __thiscall eos::core::Image<double>::operator()(Image<double> *this,int y,int x)

{
  bool bVar1;
  size_type sVar2;
  double *pdVar3;
  int x_local;
  int y_local;
  Image<double> *this_local;
  
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data_);
  if (sVar2 == 0) {
    __assert_fail("data_.size() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/core/Image.hpp"
                  ,0x47,
                  "PixelType &eos::core::Image<double>::operator()(int, int) [PixelType = double]");
  }
  bVar1 = false;
  if (-1 < y) {
    bVar1 = y < this->height_;
  }
  if (!bVar1) {
    __assert_fail("y >= 0 && y < height_",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/core/Image.hpp"
                  ,0x49,
                  "PixelType &eos::core::Image<double>::operator()(int, int) [PixelType = double]");
  }
  bVar1 = false;
  if (-1 < x) {
    bVar1 = x < this->width_;
  }
  if (!bVar1) {
    __assert_fail("x >= 0 && x < width_",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/core/Image.hpp"
                  ,0x4a,
                  "PixelType &eos::core::Image<double>::operator()(int, int) [PixelType = double]");
  }
  pdVar3 = data(this,y,x);
  return pdVar3;
}

Assistant:

PixelType& operator()(int y, int x) noexcept
    {
        assert(data_.size() > 0); // byte_ptr() checks this but let's put the assert here too, because this
                                  // function is public-facing.
        assert(y >= 0 && y < height_);
        assert(x >= 0 && x < width_);
        return *data(y, x);
    }